

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

word Nf_MatchRef_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,word Required,Vec_Int_t *vBackup)

{
  uint *puVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  uint uVar5;
  word wVar6;
  uint uVar7;
  word *pwVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  word local_50;
  
  uVar5 = *(uint *)pM;
  if (-1 < (int)uVar5) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x6ba,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)"
                 );
  }
  if (Required < pM->D) {
    __assert_fail("pM->D <= Required",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x6bb,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)"
                 );
  }
  if ((uVar5 >> 0x1e & 1) == 0) {
    if ((i < 0) || ((p->vCutSets).nSize <= i)) {
LAB_006f88a7:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = (p->vCutSets).pArray[(uint)i];
    if (iVar2 == 0) {
      return 0;
    }
    uVar7 = iVar2 >> 0x10;
    if (((int)uVar7 < 0) || ((p->vPages).nSize <= (int)uVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar5 = uVar5 >> 0x14 & 0x3ff;
    if (uVar5 == 0) {
      __assert_fail("h > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0x96,"int *Nf_CutFromHandle(int *, int)");
    }
    pvVar3 = (p->vPages).pArray[uVar7];
    bVar9 = 0;
    if ((*(byte *)((long)pvVar3 + (ulong)uVar5 * 4 + (ulong)(ushort)iVar2 * 4) & 0x1f) == 0) {
      local_50 = 0;
    }
    else {
      puVar1 = (uint *)((long)pvVar3 + (ulong)uVar5 * 4 + (ulong)(ushort)iVar2 * 4);
      uVar10 = 0;
      local_50 = 0;
      do {
        uVar5 = puVar1[(ulong)(((uint)pM->Cfg >> 8) >> (bVar9 & 0x1f) & 0xf) + 1];
        if ((ulong)uVar5 == 0) break;
        bVar11 = (((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar10 & 0x1f) & 1) != 0;
        wVar6 = p->pCells[*(uint *)pM & 0xfffff].Delays[uVar10];
        if (vBackup != (Vec_Int_t *)0x0) {
          if ((int)uVar5 < 0) goto LAB_006f8888;
          Vec_IntPush(vBackup,(uint)bVar11 + uVar5 * 2);
        }
        if ((int)uVar5 < 0) goto LAB_006f8888;
        uVar7 = (uint)bVar11 + uVar5 * 2;
        if ((p->vMapRefs).nSize <= (int)uVar7) goto LAB_006f88a7;
        piVar4 = (p->vMapRefs).pArray;
        iVar2 = piVar4[uVar7];
        if (iVar2 < 0) {
          __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x6ce,
                        "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)")
          ;
        }
        piVar4[uVar7] = iVar2 + 1;
        if (iVar2 == 0) {
          wVar6 = Nf_MatchRef_rec(p,uVar5,(uint)bVar11,
                                  (Nf_Mat_t *)
                                  (&p->pNfObjs[uVar5].M[0][0].field_0x0 +
                                  ((uint)bVar11 + (uint)bVar11 * 2) * 0x10),Required - wVar6,vBackup
                                 );
          local_50 = local_50 + wVar6;
        }
        uVar10 = uVar10 + 1;
        bVar9 = bVar9 + 4;
      } while (uVar10 < (*puVar1 & 0x1f));
    }
    pwVar8 = &p->pCells[*(uint *)pM & 0xfffff].Area;
  }
  else {
    wVar6 = p->InvDelay;
    if (vBackup != (Vec_Int_t *)0x0) {
      if (i < 0) goto LAB_006f8888;
      Vec_IntPush(vBackup,(uint)(c == 0) + i * 2);
    }
    if (i < 0) {
LAB_006f8888:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10b,"int Abc_Var2Lit(int, int)");
    }
    uVar5 = (uint)(c == 0) + i * 2;
    if ((p->vMapRefs).nSize <= (int)uVar5) goto LAB_006f88a7;
    piVar4 = (p->vMapRefs).pArray;
    iVar2 = piVar4[uVar5];
    if (iVar2 < 0) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0x6c1,
                    "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)");
    }
    piVar4[uVar5] = iVar2 + 1;
    local_50 = 0;
    if (iVar2 == 0) {
      local_50 = Nf_MatchRef_rec(p,i,(uint)(c == 0),
                                 (Nf_Mat_t *)
                                 (&p->pNfObjs[(uint)i].M[0][0].field_0x0 + (uint)(c == 0) * 0x30),
                                 Required - wVar6,vBackup);
    }
    pwVar8 = &p->InvArea;
  }
  return local_50 + *pwVar8;
}

Assistant:

word Nf_MatchRef_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, word Required, Vec_Int_t * vBackup )
{
    word Area = 0, ReqFanin;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    assert( pM->D <= Required );
    if ( pM->fCompl )
    {
        ReqFanin = Required - p->InvDelay;
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(i, !c) );
        assert( Nf_ObjMapRefNum(p, i, !c) >= 0 );
        if ( !Nf_ObjMapRefInc(p, i, !c) )
            Area += Nf_MatchRef_rec( p, i, !c, Nf_ObjMatchD(p, i, !c), ReqFanin, vBackup );
        return Area + p->InvArea;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        ReqFanin = Required - Nf_ManCell(p, pM->Gate)->Delays[k];
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(iVar, fCompl) );
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) >= 0 );
        if ( !Nf_ObjMapRefInc(p, iVar, fCompl) )
            Area += Nf_MatchRef_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl), ReqFanin, vBackup );
    }
    return Area + Nf_ManCell(p, pM->Gate)->Area;
}